

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art_iter.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_22652::
ARTIteratorTest_emptyTreeSeek_Test<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::~ARTIteratorTest_emptyTreeSeek_Test
          (ARTIteratorTest_emptyTreeSeek_Test<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTIteratorTest, emptyTreeSeek) {
  using Key = typename TypeParam::key_type;
  unodb::test::tree_verifier<TypeParam> verifier;
  TypeParam& db = verifier.get_db();  // reference to test db instance.
  {
    auto e = db.test_only_iterator();
    bool match = false;
    e.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(0)}, match,
           true /*fwd*/);
    UNODB_EXPECT_FALSE(e.valid());
    UNODB_EXPECT_FALSE(match);
  }
  {
    auto e = db.test_only_iterator();
    bool match = false;
    e.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(0)}, match,
           false /*fwd*/);
    UNODB_EXPECT_FALSE(e.valid());
    UNODB_EXPECT_FALSE(match);
  }
}